

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_sse4.c
# Opt level: O2

void obmc_variance_w8n(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse,int *sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int height;
  
  iVar3 = height + 1;
  auVar5 = ZEXT1664((undefined1  [16])0x0);
  lVar4 = 0;
  auVar6._8_4_ = 0x800;
  auVar6._0_8_ = 0x80000000800;
  auVar6._12_4_ = 0x800;
  auVar6._16_4_ = 0x800;
  auVar6._20_4_ = 0x800;
  auVar6._24_4_ = 0x800;
  auVar6._28_4_ = 0x800;
  auVar7 = ZEXT1664((undefined1  [16])0x0);
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)pre;
    auVar8 = vpmovzxbd_avx2(auVar1);
    auVar8 = vpmaddwd_avx2(auVar8,*(undefined1 (*) [32])((long)mask + lVar4));
    auVar8 = vpsubd_avx2(*(undefined1 (*) [32])((long)wsrc + lVar4),auVar8);
    auVar9 = vpsrad_avx2(auVar8,0x1f);
    auVar8 = vpaddd_avx2(auVar8,auVar6);
    auVar8 = vpaddd_avx2(auVar8,auVar9);
    auVar8 = vpsrad_avx2(auVar8,0xc);
    auVar1 = vpackssdw_avx(auVar8._0_16_,auVar8._16_16_);
    auVar1 = vpmaddwd_avx(auVar1,auVar1);
    auVar1 = vpaddd_avx(auVar1,auVar5._0_16_);
    auVar5 = ZEXT1664(auVar1);
    auVar2 = vpaddd_avx(auVar7._0_16_,auVar8._0_16_);
    auVar2 = vpaddd_avx(auVar2,auVar8._16_16_);
    auVar7 = ZEXT1664(auVar2);
    pre = (uint8_t *)((long)pre + (long)pre_stride);
    lVar4 = lVar4 + 0x20;
    iVar3 = iVar3 + -1;
  } while (1 < iVar3);
  auVar1 = vphaddd_avx(auVar2,auVar1);
  auVar1 = vphaddd_avx(auVar1,auVar1);
  *sum = auVar1._0_4_;
  *sse = auVar1._4_4_;
  return;
}

Assistant:

static inline void obmc_variance_w8n(const uint8_t *pre, const int pre_stride,
                                     const int32_t *wsrc, const int32_t *mask,
                                     unsigned int *const sse, int *const sum,
                                     const int w, const int h) {
  const int pre_step = pre_stride - w;
  int n = 0;
  __m128i v_sum_d = _mm_setzero_si128();
  __m128i v_sse_d = _mm_setzero_si128();

  assert(w >= 8);
  assert(IS_POWER_OF_TWO(w));
  assert(IS_POWER_OF_TWO(h));

  do {
    const __m128i v_p1_b = xx_loadl_32(pre + n + 4);
    const __m128i v_m1_d = xx_load_128(mask + n + 4);
    const __m128i v_w1_d = xx_load_128(wsrc + n + 4);
    const __m128i v_p0_b = xx_loadl_32(pre + n);
    const __m128i v_m0_d = xx_load_128(mask + n);
    const __m128i v_w0_d = xx_load_128(wsrc + n);

    const __m128i v_p0_d = _mm_cvtepu8_epi32(v_p0_b);
    const __m128i v_p1_d = _mm_cvtepu8_epi32(v_p1_b);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m128i v_pm0_d = _mm_madd_epi16(v_p0_d, v_m0_d);
    const __m128i v_pm1_d = _mm_madd_epi16(v_p1_d, v_m1_d);

    const __m128i v_diff0_d = _mm_sub_epi32(v_w0_d, v_pm0_d);
    const __m128i v_diff1_d = _mm_sub_epi32(v_w1_d, v_pm1_d);

    const __m128i v_rdiff0_d = xx_roundn_epi32(v_diff0_d, 12);
    const __m128i v_rdiff1_d = xx_roundn_epi32(v_diff1_d, 12);
    const __m128i v_rdiff01_w = _mm_packs_epi32(v_rdiff0_d, v_rdiff1_d);
    const __m128i v_sqrdiff_d = _mm_madd_epi16(v_rdiff01_w, v_rdiff01_w);

    v_sum_d = _mm_add_epi32(v_sum_d, v_rdiff0_d);
    v_sum_d = _mm_add_epi32(v_sum_d, v_rdiff1_d);
    v_sse_d = _mm_add_epi32(v_sse_d, v_sqrdiff_d);

    n += 8;

    if (n % w == 0) pre += pre_step;
  } while (n < w * h);

  *sum = xx_hsum_epi32_si32(v_sum_d);
  *sse = xx_hsum_epi32_si32(v_sse_d);
}